

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

_Bool extract_if_dead(connectdata *conn,Curl_easy *data)

{
  _func_uint_connectdata_ptr_uint *p_Var1;
  uint uVar2;
  int iVar3;
  _Bool _Var4;
  
  if ((conn->send_pipe).size + (conn->recv_pipe).size == 0) {
    conn->data = data;
    p_Var1 = conn->handler->connection_check;
    if (p_Var1 == (_func_uint_connectdata_ptr_uint *)0x0) {
      iVar3 = Curl_socket_check(conn->sock[0],-1,-1,0);
      if (iVar3 == 0) {
        return false;
      }
    }
    else {
      uVar2 = (*p_Var1)(conn,1);
      if ((uVar2 & 1) == 0) goto LAB_0011d9c4;
    }
    Curl_infof(data,"Connection %ld seems to be dead!\n",conn->connection_id);
    Curl_conncache_remove_conn(conn,false);
    conn->data = (Curl_easy *)0x0;
    _Var4 = true;
  }
  else {
LAB_0011d9c4:
    _Var4 = false;
  }
  return _Var4;
}

Assistant:

static bool extract_if_dead(struct connectdata *conn,
                            struct Curl_easy *data)
{
  size_t pipeLen = conn->send_pipe.size + conn->recv_pipe.size;
  if(!pipeLen && !CONN_INUSE(conn)) {
    /* The check for a dead socket makes sense only if there are no
       handles in pipeline and the connection isn't already marked in
       use */
    bool dead;

    conn->data = data;
    if(conn->handler->connection_check) {
      /* The protocol has a special method for checking the state of the
         connection. Use it to check if the connection is dead. */
      unsigned int state;

      state = conn->handler->connection_check(conn, CONNCHECK_ISDEAD);
      dead = (state & CONNRESULT_DEAD);
    }
    else {
      /* Use the general method for determining the death of a connection */
      dead = SocketIsDead(conn->sock[FIRSTSOCKET]);
    }

    if(dead) {
      infof(data, "Connection %ld seems to be dead!\n", conn->connection_id);
      Curl_conncache_remove_conn(conn, FALSE);
      conn->data = NULL; /* detach */
      return TRUE;
    }
  }
  return FALSE;
}